

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O1

int Io_WriteBench(Abc_Ntk_t *pNtk,char *pFileName)

{
  long *plVar1;
  long *plVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  ProgressBar *p;
  Vec_Ptr_t *pVVar6;
  size_t __size;
  long lVar7;
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_NETLIST)) {
    __assert_fail("Abc_NtkIsSopNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                  ,0x39,"int Io_WriteBench(Abc_Ntk_t *, const char *)");
  }
  iVar3 = Io_WriteBenchCheckNames(pNtk);
  if (iVar3 == 0) {
    pcVar5 = 
    "Io_WriteBench(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n"
    ;
    __size = 0x90;
  }
  else {
    __stream = fopen(pFileName,"w");
    if (__stream != (FILE *)0x0) {
      pcVar5 = pNtk->pName;
      pcVar4 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar5,pcVar4);
      pVVar6 = pNtk->vPis;
      if (0 < pVVar6->nSize) {
        lVar7 = 0;
        do {
          pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*pVVar6->pArray[lVar7] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar6->pArray[lVar7] + 0x30) * 8));
          fprintf(__stream,"INPUT(%s)\n",pcVar5);
          lVar7 = lVar7 + 1;
          pVVar6 = pNtk->vPis;
        } while (lVar7 < pVVar6->nSize);
      }
      pVVar6 = pNtk->vPos;
      if (0 < pVVar6->nSize) {
        lVar7 = 0;
        do {
          pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*pVVar6->pArray[lVar7] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar6->pArray[lVar7] + 0x20) * 8));
          fprintf(__stream,"OUTPUT(%s)\n",pcVar5);
          lVar7 = lVar7 + 1;
          pVVar6 = pNtk->vPos;
        } while (lVar7 < pVVar6->nSize);
      }
      pVVar6 = pNtk->vBoxes;
      if (0 < pVVar6->nSize) {
        lVar7 = 0;
        do {
          plVar1 = (long *)pVVar6->pArray[lVar7];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
            pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)plVar2[6] * 8));
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8);
            pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[4] * 8));
            fprintf(__stream,"%-11s = DFF(%s)\n",pcVar5,pcVar4);
          }
          lVar7 = lVar7 + 1;
          pVVar6 = pNtk->vBoxes;
        } while (lVar7 < pVVar6->nSize);
      }
      p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
      pVVar6 = pNtk->vObjs;
      if (0 < pVVar6->nSize) {
        lVar7 = 0;
        do {
          pNode = (Abc_Obj_t *)pVVar6->pArray[lVar7];
          if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
            if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar7)) {
              Extra_ProgressBarUpdate_int(p,(int)lVar7,(char *)0x0);
            }
            if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
              __assert_fail("Abc_ObjIsNode(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                            ,0x86,"int Io_WriteBenchOneNode(FILE *, Abc_Obj_t *)");
            }
            iVar3 = (pNode->vFanins).nSize;
            if (iVar3 == 1) {
              iVar3 = Abc_NodeIsBuf(pNode);
              pcVar5 = Abc_ObjName((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
              if (iVar3 == 0) {
                pcVar4 = "%-11s = NOT(";
              }
              else {
                pcVar4 = "%-11s = BUFF(";
              }
              fprintf(__stream,pcVar4,pcVar5);
              pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]
                                  );
            }
            else {
              if (iVar3 == 0) {
                iVar3 = Abc_NodeIsConst1(pNode);
                if (iVar3 == 0) {
                  __assert_fail("Abc_NodeIsConst1(pNode)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                                ,0x8a,"int Io_WriteBenchOneNode(FILE *, Abc_Obj_t *)");
                }
                pcVar5 = Abc_ObjName((Abc_Obj_t *)
                                     pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
                fprintf(__stream,"%-11s",pcVar5);
                fwrite(" = vdd\n",7,1,__stream);
                goto LAB_0033a222;
              }
              pcVar5 = Abc_ObjName((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
              fprintf(__stream,"%-11s",pcVar5);
              pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]
                                  );
              fprintf(__stream," = AND(%s, ",pcVar5);
              pcVar5 = Abc_ObjName((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
            }
            fprintf(__stream,"%s)\n",pcVar5);
          }
LAB_0033a222:
          lVar7 = lVar7 + 1;
          pVVar6 = pNtk->vObjs;
        } while (lVar7 < pVVar6->nSize);
      }
      Extra_ProgressBarStop(p);
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        puts("Io_WriteBench: EXDC is not written (warning).");
      }
      fclose(__stream);
      return 1;
    }
    pcVar5 = "Io_WriteBench(): Cannot open the output file.\n";
    __size = 0x2e;
  }
  fwrite(pcVar5,__size,1,_stdout);
  return 0;
}

Assistant:

int Io_WriteBench( Abc_Ntk_t * pNtk, const char * pFileName )
{
    Abc_Ntk_t * pExdc;
    FILE * pFile;
    assert( Abc_NtkIsSopNetlist(pNtk) );
    if ( !Io_WriteBenchCheckNames(pNtk) )
    {
        fprintf( stdout, "Io_WriteBench(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n" );
        return 0;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBench(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the network
    Io_WriteBenchOne( pFile, pNtk );
    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
        printf( "Io_WriteBench: EXDC is not written (warning).\n" );
    // finalize the file
    fclose( pFile );
    return 1;
}